

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VListNameToNum(VList *pIn,char *zName,int nName)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int local_3c;
  
  if (pIn != (VList *)0x0) {
    iVar1 = pIn[1];
    iVar4 = 2;
    do {
      iVar3 = strncmp((char *)(pIn + (long)iVar4 + 2),zName,(long)nName);
      if ((iVar3 == 0) && (*(char *)((long)(pIn + (long)iVar4 + 2) + (long)nName) == '\0')) {
        local_3c = pIn[iVar4];
        bVar2 = false;
      }
      else {
        iVar4 = iVar4 + (pIn + iVar4)[1];
        bVar2 = true;
      }
      if (!bVar2) {
        return local_3c;
      }
    } while (iVar4 < iVar1);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VListNameToNum(VList *pIn, const char *zName, int nName){
  int i, mx;
  if( pIn==0 ) return 0;
  mx = pIn[1];
  i = 2;
  do{
    const char *z = (const char*)&pIn[i+2];
    if( strncmp(z,zName,nName)==0 && z[nName]==0 ) return pIn[i];
    i += pIn[i+1];
  }while( i<mx );
  return 0;
}